

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_mdtm_resp(Curl_easy *data,int ftpcode)

{
  undefined1 *puVar1;
  uchar uVar2;
  FILEPROTO *pFVar3;
  connectdata *pcVar4;
  long lVar5;
  long lVar6;
  curl_trc_feat *pcVar7;
  bool bVar8;
  CURLcode CVar9;
  int iVar10;
  char *pcVar11;
  size_t sVar12;
  time_t tVar13;
  CURLcode CVar14;
  tm buffer;
  char timebuf [24];
  
  pFVar3 = (data->req).p.file;
  if (ftpcode == 0x226) {
    CVar9 = CURLE_OK;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))) {
      pcVar11 = "MDTM failed: file does not exist or permission problem, continuing";
LAB_0012ccb5:
      CVar9 = CURLE_OK;
      Curl_infof(data,pcVar11);
    }
  }
  else if (ftpcode == 0xd5) {
    pcVar4 = data->conn;
    pcVar11 = Curl_dyn_ptr(&(pcVar4->proto).ftpc.pp.recvbuf);
    sVar12 = strlen(pcVar11 + 4);
    if (sVar12 < 0xe) {
      bVar8 = false;
    }
    else {
      bVar8 = false;
      if ((((int)pcVar11[9] + pcVar11[8] * 10 + -0x210 < 0xd) &&
          ((int)pcVar11[0xb] + pcVar11[10] * 10 + -0x210 < 0x20)) &&
         ((int)pcVar11[0xd] + pcVar11[0xc] * 10 + -0x210 < 0x18)) {
        bVar8 = (int)pcVar11[0x11] + pcVar11[0x10] * 10 + -0x210 < 0x3d &&
                (int)pcVar11[0xf] + pcVar11[0xe] * 10 + -0x210 < 0x3c;
      }
    }
    if (bVar8) {
      curl_msnprintf(timebuf,0x18,"%04d%02d%02d %02d:%02d:%02d GMT");
      tVar13 = Curl_getdate_capped(timebuf);
      (data->info).filetime = tVar13;
    }
    bVar8 = true;
    CVar14 = CURLE_OK;
    CVar9 = CURLE_OK;
    if (((((data->req).field_0xdb & 2) != 0) &&
        (CVar9 = CVar14, (pcVar4->proto).ftpc.file != (char *)0x0)) &&
       ((((data->set).field_0x895 & 4) != 0 && (lVar5 = (data->info).filetime, -1 < lVar5)))) {
      CVar9 = Curl_gmtime(lVar5,&buffer);
      if (CVar9 == CURLE_OK) {
        iVar10 = 6;
        if (buffer.tm_wday != 0) {
          iVar10 = buffer.tm_wday + -1;
        }
        bVar8 = false;
        iVar10 = curl_msnprintf(timebuf,0x80,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n"
                                ,Curl_wkday[iVar10],(ulong)(uint)buffer.tm_mday,
                                Curl_month[buffer.tm_mon],(ulong)(buffer.tm_year + 0x76c),
                                (ulong)(uint)buffer.tm_hour,(ulong)(uint)buffer.tm_min,
                                (ulong)(uint)buffer.tm_sec);
        CVar9 = client_write_header(data,timebuf,(long)iVar10);
        if (CVar9 == CURLE_OK) {
          bVar8 = true;
          CVar9 = CURLE_OK;
        }
      }
      else {
        bVar8 = false;
      }
    }
    if (!bVar8) {
      return CVar9;
    }
  }
  else {
    CVar9 = CURLE_OK;
    if (((data != (Curl_easy *)0x0) && (CVar9 = CURLE_OK, ((data->set).field_0x897 & 0x40) != 0)) &&
       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))) {
      pcVar11 = "unsupported MDTM reply format";
      goto LAB_0012ccb5;
    }
  }
  uVar2 = (data->set).timecondition;
  if (uVar2 == '\0') {
LAB_0012cf42:
    if (CVar9 == CURLE_OK) {
      CVar9 = ftp_state_type(data);
    }
    return CVar9;
  }
  lVar5 = (data->info).filetime;
  if ((lVar5 < 1) || (lVar6 = (data->set).timevalue, lVar6 < 1)) {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))) {
      Curl_infof(data,"Skipping time comparison");
    }
    goto LAB_0012cf42;
  }
  if (uVar2 == '\x02') {
    if (lVar5 <= lVar6) goto LAB_0012cf42;
    if (((data == (Curl_easy *)0x0) || (((data->set).field_0x897 & 0x40) == 0)) ||
       ((pcVar7 = (data->state).feat, pcVar7 != (curl_trc_feat *)0x0 && (pcVar7->log_level < 1))))
    goto LAB_0012cf83;
    pcVar11 = "The requested document is not old enough";
  }
  else {
    if (lVar6 < lVar5) goto LAB_0012cf42;
    if (((data == (Curl_easy *)0x0) || (((data->set).field_0x897 & 0x40) == 0)) ||
       ((pcVar7 = (data->state).feat, pcVar7 != (curl_trc_feat *)0x0 && (pcVar7->log_level < 1))))
    goto LAB_0012cf83;
    pcVar11 = "The requested document is not new enough";
  }
  Curl_infof(data,pcVar11);
LAB_0012cf83:
  pFVar3->fd = 2;
  puVar1 = &(data->info).field_0xf4;
  *puVar1 = *puVar1 | 1;
  _ftp_state(data,'\0');
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_state_mdtm_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  switch(ftpcode) {
  case 213:
    {
      /* we got a time. Format should be: "YYYYMMDDHHMMSS[.sss]" where the
         last .sss part is optional and means fractions of a second */
      int year, month, day, hour, minute, second;
      struct pingpong *pp = &ftpc->pp;
      char *resp = Curl_dyn_ptr(&pp->recvbuf) + 4;
      if(ftp_213_date(resp, &year, &month, &day, &hour, &minute, &second)) {
        /* we have a time, reformat it */
        char timebuf[24];
        msnprintf(timebuf, sizeof(timebuf),
                  "%04d%02d%02d %02d:%02d:%02d GMT",
                  year, month, day, hour, minute, second);
        /* now, convert this into a time() value: */
        data->info.filetime = Curl_getdate_capped(timebuf);
      }

#ifdef CURL_FTP_HTTPSTYLE_HEAD
      /* If we asked for a time of the file and we actually got one as well,
         we "emulate" an HTTP-style header in our output. */

#if defined(__GNUC__) && (defined(__DJGPP__) || defined(__AMIGA__))
#pragma GCC diagnostic push
/* 'time_t' is unsigned in MSDOS and AmigaOS. Silence:
   warning: comparison of unsigned expression in '>= 0' is always true */
#pragma GCC diagnostic ignored "-Wtype-limits"
#endif
      if(data->req.no_body &&
         ftpc->file &&
         data->set.get_filetime &&
         (data->info.filetime >= 0) ) {
#if defined(__GNUC__) && (defined(__DJGPP__) || defined(__AMIGA__))
#pragma GCC diagnostic pop
#endif
        char headerbuf[128];
        int headerbuflen;
        time_t filetime = data->info.filetime;
        struct tm buffer;
        const struct tm *tm = &buffer;

        result = Curl_gmtime(filetime, &buffer);
        if(result)
          return result;

        /* format: "Tue, 15 Nov 1994 12:45:26" */
        headerbuflen =
          msnprintf(headerbuf, sizeof(headerbuf),
                    "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                    Curl_wkday[tm->tm_wday ? tm->tm_wday-1 : 6],
                    tm->tm_mday,
                    Curl_month[tm->tm_mon],
                    tm->tm_year + 1900,
                    tm->tm_hour,
                    tm->tm_min,
                    tm->tm_sec);
        result = client_write_header(data, headerbuf, headerbuflen);
        if(result)
          return result;
      } /* end of a ridiculous amount of conditionals */
#endif
    }
    break;
  default:
    infof(data, "unsupported MDTM reply format");
    break;
  case 550: /* 550 is used for several different problems, e.g.
               "No such file or directory" or "Permission denied".
               It does not mean that the file does not exist at all. */
    infof(data, "MDTM failed: file does not exist or permission problem,"
          " continuing");
    break;
  }

  if(data->set.timecondition) {
    if((data->info.filetime > 0) && (data->set.timevalue > 0)) {
      switch(data->set.timecondition) {
      case CURL_TIMECOND_IFMODSINCE:
      default:
        if(data->info.filetime <= data->set.timevalue) {
          infof(data, "The requested document is not new enough");
          ftp->transfer = PPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          ftp_state(data, FTP_STOP);
          return CURLE_OK;
        }
        break;
      case CURL_TIMECOND_IFUNMODSINCE:
        if(data->info.filetime > data->set.timevalue) {
          infof(data, "The requested document is not old enough");
          ftp->transfer = PPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          ftp_state(data, FTP_STOP);
          return CURLE_OK;
        }
        break;
      } /* switch */
    }
    else {
      infof(data, "Skipping time comparison");
    }
  }

  if(!result)
    result = ftp_state_type(data);

  return result;
}